

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_writer_init_cfile(mz_zip_archive *pZip,FILE *pFile,mz_uint flags)

{
  mz_bool mVar1;
  mz_uint64 mVar2;
  
  pZip->m_pWrite = mz_zip_file_write_func;
  pZip->m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
  if ((short)flags < 0) {
    pZip->m_pRead = mz_zip_file_read_func;
  }
  pZip->m_pIO_opaque = pZip;
  mVar1 = mz_zip_writer_init_v2(pZip,0,flags);
  if (mVar1 != 0) {
    pZip->m_pState->m_pFile = pFile;
    mVar2 = ftello((FILE *)pFile);
    pZip->m_pState->m_file_archive_start_ofs = mVar2;
    pZip->m_zip_type = MZ_ZIP_TYPE_CFILE;
  }
  return (uint)(mVar1 != 0);
}

Assistant:

mz_bool mz_zip_writer_init_cfile(mz_zip_archive *pZip, MZ_FILE *pFile, mz_uint flags)
{
    pZip->m_pWrite = mz_zip_file_write_func;
    pZip->m_pNeeds_keepalive = NULL;

    if (flags & MZ_ZIP_FLAG_WRITE_ALLOW_READING)
        pZip->m_pRead = mz_zip_file_read_func;

    pZip->m_pIO_opaque = pZip;

    if (!mz_zip_writer_init_v2(pZip, 0, flags))
        return MZ_FALSE;

    pZip->m_pState->m_pFile = pFile;
    pZip->m_pState->m_file_archive_start_ofs = MZ_FTELL64(pZip->m_pState->m_pFile);
    pZip->m_zip_type = MZ_ZIP_TYPE_CFILE;

    return MZ_TRUE;
}